

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_api.c
# Opt level: O2

MPP_RET h265e_proc_cfg(void *ctx,MpiCmd cmd,void *param)

{
  int iVar1;
  long lVar2;
  RK_U32 change;
  MPP_RET MVar3;
  uint uVar4;
  MppPacket pkt_out;
  
  lVar2 = *ctx;
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_api","enter ctx %p cmd %08x\n","h265e_proc_cfg",ctx,(ulong)cmd);
  }
  MVar3 = MPP_OK;
  if (cmd == MPP_ENC_SET_SPLIT) {
    iVar1 = *(int *)((long)param + 4);
    if (iVar1 == 0) {
      *(undefined4 *)(lVar2 + 0x400) = 0;
    }
    else {
      *(undefined4 *)(lVar2 + 0x400) = 1;
      *(uint *)(lVar2 + 0x404) = (uint)(iVar1 == 2);
      *(undefined4 *)(lVar2 + 0x408) = *(undefined4 *)((long)param + 8);
    }
  }
  else if (cmd == MPP_ENC_SET_PREP_CFG) {
    MVar3 = h265e_proc_prep_cfg((MppEncPrepCfg *)(lVar2 + 8),(MppEncPrepCfg *)param);
  }
  else if (cmd == MPP_ENC_SET_CODEC_CFG) {
    h265e_proc_h265_cfg((MppEncH265Cfg *)(lVar2 + 0x348),(MppEncH265Cfg *)((long)param + 8));
  }
  else if (cmd == MPP_ENC_GET_EXTRA_INFO) {
    h265e_set_extra_info((H265eCtx *)ctx);
    h265e_get_extra_info((H265eCtx *)ctx,param);
  }
  else {
    MVar3 = MPP_OK;
    if (cmd != MPP_ENC_SET_SEI_CFG) {
      if (cmd == MPP_ENC_SET_CFG) {
        if (*(int *)((long)param + 0x10) == 0) {
          MVar3 = MPP_OK;
        }
        else {
          MVar3 = h265e_proc_prep_cfg((MppEncPrepCfg *)(lVar2 + 8),
                                      (MppEncPrepCfg *)((long)param + 0x10));
          ((MppEncPrepCfg *)((long)param + 0x10))->change = 0;
        }
        if (*(int *)(lVar2 + 0x164) != 0) {
          uVar4 = (((*(int *)(lVar2 + 0xc + (ulong)(*(int *)(lVar2 + 0x168) == 0) * 4) + 0x3f >> 6)
                   + *(uint *)(lVar2 + 0x16c)) - 1) / *(uint *)(lVar2 + 0x16c);
          if ((int)*(uint *)(lVar2 + 0xc4) < (int)uVar4) {
            uVar4 = *(uint *)(lVar2 + 0xc4);
          }
          *(uint *)(lVar2 + 0x170) = uVar4;
        }
        if (*(int *)((long)param + 0x350) != 0) {
          h265e_proc_h265_cfg((MppEncH265Cfg *)(lVar2 + 0x348),
                              (MppEncH265Cfg *)((long)param + 0x350));
          ((MppEncH265Cfg *)((long)param + 0x350))->change = 0;
        }
        uVar4 = *(uint *)((long)param + 0xe98);
        if (uVar4 != 0) {
          if ((uVar4 & 1) != 0) {
            *(undefined8 *)(lVar2 + 0xe94) = *(undefined8 *)((long)param + 0xe9c);
          }
          if ((uVar4 & 2) != 0) {
            *(undefined4 *)(lVar2 + 0xe98) = *(undefined4 *)((long)param + 0xea0);
          }
          if ((uVar4 & 4) != 0) {
            *(undefined4 *)(lVar2 + 0xe9c) = *(undefined4 *)((long)param + 0xea4);
          }
          if (*(int *)(lVar2 + 0xe94) == 0) {
            *(undefined8 *)(lVar2 + 0xe98) = 0;
          }
          *(uint *)(lVar2 + 0xe90) = *(uint *)(lVar2 + 0xe90) | uVar4;
          *(undefined4 *)((long)param + 0xe98) = 0;
        }
      }
      else {
        _mpp_log_l(2,"h265e_api","No correspond %08x found, and can not config!\n",(char *)0x0,
                   (ulong)cmd);
        MVar3 = MPP_NOK;
      }
    }
  }
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_api","leave ctx %p\n","h265e_proc_cfg",ctx);
  }
  return MVar3;
}

Assistant:

static MPP_RET h265e_proc_cfg(void *ctx, MpiCmd cmd, void *param)
{
    H265eCtx *p = (H265eCtx *)ctx;
    MppEncCfgSet *cfg = p->cfg;
    MPP_RET ret = MPP_OK;

    h265e_dbg_func("enter ctx %p cmd %08x\n", ctx, cmd);

    switch (cmd) {
    case MPP_ENC_SET_CFG : {
        MppEncCfgImpl *impl = (MppEncCfgImpl *)param;
        MppEncCfgSet *src = &impl->cfg;

        if (src->prep.change) {
            ret |= h265e_proc_prep_cfg(&cfg->prep, &src->prep);
            src->prep.change = 0;
        }

        if (cfg->rc.refresh_en) {
            RK_U32 mb_rows;

            if (MPP_ENC_RC_INTRA_REFRESH_ROW == cfg->rc.refresh_mode)
                mb_rows = MPP_ALIGN(cfg->prep.height, 64) / 64;
            else
                mb_rows = MPP_ALIGN(cfg->prep.width, 64) / 64;

            cfg->rc.refresh_length = (mb_rows + cfg->rc.refresh_num - 1) / cfg->rc.refresh_num;
            if (cfg->rc.gop < cfg->rc.refresh_length)
                cfg->rc.refresh_length = cfg->rc.gop;
        }

        if (src->codec.h265.change) {
            ret |= h265e_proc_h265_cfg(&cfg->codec.h265, &src->codec.h265);
            src->codec.h265.change = 0;
        }
        if (src->split.change) {
            ret |= h265e_proc_split_cfg(&cfg->split, &src->split);
            src->split.change = 0;
        }
    } break;
    case MPP_ENC_GET_EXTRA_INFO: {
        MppPacket pkt_out = (MppPacket )param;
        h265e_set_extra_info(p);
        h265e_get_extra_info(p, pkt_out);
    } break;
    case MPP_ENC_SET_PREP_CFG : {
        ret = h265e_proc_prep_cfg(&cfg->prep, param);
    } break;
    case MPP_ENC_SET_CODEC_CFG: {
        MppEncCodecCfg *codec = (MppEncCodecCfg *)param;
        ret = h265e_proc_h265_cfg(&cfg->codec.h265, &codec->h265);
    } break;

    case MPP_ENC_SET_SEI_CFG: {
    } break;
    case MPP_ENC_SET_SPLIT : {
        MppEncSliceSplit *src = (MppEncSliceSplit *)param;
        MppEncH265SliceCfg *slice_cfg = &cfg->codec.h265.slice_cfg;

        if (src->split_mode > MPP_ENC_SPLIT_NONE) {
            slice_cfg->split_enable = 1;
            slice_cfg->split_mode = 0;
            if (src->split_mode == MPP_ENC_SPLIT_BY_CTU)
                slice_cfg->split_mode = 1;
            slice_cfg->slice_size =  src->split_arg;
        } else {
            slice_cfg->split_enable = 0;
        }
    } break;
    default:
        mpp_err("No correspond %08x found, and can not config!\n", cmd);
        ret = MPP_NOK;
        break;
    }

    h265e_dbg_func("leave ctx %p\n", ctx);
    return ret;
}